

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iter.c
# Opt level: O2

bson_t * get_bson(char *filename)

{
  int __fd;
  ulong uVar1;
  bson_t *pbVar2;
  char *__format;
  uint8_t buf [4096];
  
  __fd = open(filename,0);
  if (__fd == -1) {
    __format = "Failed to open: %s\n";
  }
  else {
    uVar1 = read(__fd,buf,0x1000);
    if (-1 < (long)uVar1) {
      if (uVar1 != 0) {
        pbVar2 = (bson_t *)bson_new_from_data(buf,uVar1 & 0xffffffff);
        close(__fd);
        return pbVar2;
      }
      fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-iter.c"
              ,0x30,"get_bson","len > 0");
      abort();
    }
    __format = "Failed to read: %s\n";
  }
  fprintf(_stderr,__format,filename);
  abort();
}

Assistant:

static bson_t *
get_bson (const char *filename)
{
   uint8_t buf[4096];
   bson_t *b;
   ssize_t len;
   int fd;

   if (-1 == (fd = bson_open (filename, O_RDONLY))) {
      fprintf (stderr, "Failed to open: %s\n", filename);
      abort ();
   }
   if ((len = bson_read (fd, buf, sizeof buf)) < 0) {
      fprintf (stderr, "Failed to read: %s\n", filename);
      abort ();
   }
   BSON_ASSERT (len > 0);
   b = bson_new_from_data (buf, (uint32_t) len);
   bson_close (fd);

   return b;
}